

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_uuencode.c
# Opt level: O1

int archive_filter_uuencode_write(archive_write_filter *f,void *buff,size_t length)

{
  uchar uVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  
  iVar3 = 0;
  if (length != 0) {
    pvVar2 = f->data;
    if (*(long *)((long)pvVar2 + 0x40) != 0) {
      uVar4 = *(ulong *)((long)pvVar2 + 0x40);
      bVar7 = uVar4 < 0x2d;
      sVar6 = length;
      if (bVar7) {
        do {
          uVar1 = *buff;
          buff = (void *)((long)buff + 1);
          *(ulong *)((long)pvVar2 + 0x40) = uVar4 + 1;
          *(uchar *)((long)pvVar2 + uVar4 + 0x48) = uVar1;
          length = sVar6 - 1;
          uVar4 = *(ulong *)((long)pvVar2 + 0x40);
          bVar7 = uVar4 < 0x2d;
          if (!bVar7) break;
          bVar8 = sVar6 != 1;
          sVar6 = length;
        } while (bVar8);
      }
      if (bVar7) {
        return 0;
      }
      uu_encode((archive_string *)((long)pvVar2 + 0x20),(uchar *)((long)pvVar2 + 0x48),0x2d);
      *(undefined8 *)((long)pvVar2 + 0x40) = 0;
    }
    if (0x2c < length) {
      do {
        uu_encode((archive_string *)((long)pvVar2 + 0x20),(uchar *)buff,0x2d);
        length = length - 0x2d;
        buff = (void *)((long)buff + 0x2d);
      } while (0x2c < length);
    }
    if (length != 0) {
      memcpy((void *)((long)pvVar2 + 0x48),buff,length);
      *(size_t *)((long)pvVar2 + 0x40) = length;
    }
    uVar4 = *(ulong *)((long)pvVar2 + 0x38);
    iVar3 = 0;
    if (uVar4 <= *(ulong *)((long)pvVar2 + 0x28)) {
      do {
        iVar3 = __archive_write_filter(f->next_filter,*(void **)((long)pvVar2 + 0x20),uVar4);
        memmove(*(void **)((long)pvVar2 + 0x20),
                (void *)((long)*(void **)((long)pvVar2 + 0x20) + *(long *)((long)pvVar2 + 0x38)),
                *(long *)((long)pvVar2 + 0x28) - *(long *)((long)pvVar2 + 0x38));
        uVar4 = *(ulong *)((long)pvVar2 + 0x38);
        uVar5 = *(long *)((long)pvVar2 + 0x28) - uVar4;
        *(ulong *)((long)pvVar2 + 0x28) = uVar5;
      } while (uVar4 <= uVar5);
    }
  }
  return iVar3;
}

Assistant:

static int
archive_filter_uuencode_write(struct archive_write_filter *f, const void *buff,
    size_t length)
{
	struct private_uuencode *state = (struct private_uuencode *)f->data;
	const unsigned char *p = buff;
	int ret = ARCHIVE_OK;

	if (length == 0)
		return (ret);

	if (state->hold_len) {
		while (state->hold_len < LBYTES && length > 0) {
			state->hold[state->hold_len++] = *p++;
			length--;
		}
		if (state->hold_len < LBYTES)
			return (ret);
		uu_encode(&state->encoded_buff, state->hold, LBYTES);
		state->hold_len = 0;
	}

	for (; length >= LBYTES; length -= LBYTES, p += LBYTES)
		uu_encode(&state->encoded_buff, p, LBYTES);

	/* Save remaining bytes. */
	if (length > 0) {
		memcpy(state->hold, p, length);
		state->hold_len = length;
	}
	while (archive_strlen(&state->encoded_buff) >= state->bs) {
		ret = __archive_write_filter(f->next_filter,
		    state->encoded_buff.s, state->bs);
		memmove(state->encoded_buff.s,
		    state->encoded_buff.s + state->bs,
		    state->encoded_buff.length - state->bs);
		state->encoded_buff.length -= state->bs;
	}

	return (ret);
}